

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

float tcu::bilinearInterpolate(Vec4 *values,float x,float y)

{
  return x * values->m_data[3] * y +
         (1.0 - x) * values->m_data[2] * y +
         (1.0 - y) * values->m_data[0] * (1.0 - x) + values->m_data[1] * x * (1.0 - y);
}

Assistant:

static float bilinearInterpolate (const Vec4& values, const float x, const float y)
{
	const float		v00		= values[0];
	const float		v10		= values[1];
	const float		v01		= values[2];
	const float		v11		= values[3];
	const float		res		= v00*(1.0f-x)*(1.0f-y) + v10*x*(1.0f-y) + v01*(1.0f-x)*y + v11*x*y;
	return res;
}